

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O0

string * zpsoe::zlog::get_current_date_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  allocator<char> local_71;
  time_t local_70;
  time_t t;
  char buf [80];
  
  local_70 = time((time_t *)0x0);
  __tp = localtime(&local_70);
  strftime((char *)&t,0x50,"%Y-%m-%d %H:%M:%S",__tp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,(char *)&t,&local_71);
  std::allocator<char>::~allocator(&local_71);
  return in_RDI;
}

Assistant:

string get_current_date() {
    char buf[80];
    time_t t = time(NULL);
    strftime(buf, 80, "%Y-%m-%d %H:%M:%S", localtime(&t));
    return string(buf);
}